

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O1

void __thiscall InstructionGenerator::genConsoleOut(InstructionGenerator *this,uint argCount)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator iVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  uint uVar2;
  uint local_58 [2];
  Variable local_50;
  
  this_00 = this->bytecode;
  local_58[1] = 0;
  iVar1._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_58[0] = argCount;
  if (iVar1._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              (this_00,iVar1,(Instruction *)(local_58 + 1));
  }
  else {
    *iVar1._M_current = 0;
    (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
  iVar1._M_current = *(uint **)(this_01 + 8);
  if (iVar1._M_current == *(uint **)(this_01 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              (this_01,iVar1,local_58);
  }
  else {
    *iVar1._M_current = local_58[0];
    *(uint **)(this_01 + 8) = iVar1._M_current + 1;
  }
  if (local_58[0] != 0) {
    uVar2 = 0;
    do {
      VirtualStack::pop(&local_50,&this->super_VirtualStack);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.identifier._M_dataplus._M_p != &local_50.identifier.field_2) {
        operator_delete(local_50.identifier._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_58[0]);
  }
  return;
}

Assistant:

void InstructionGenerator::genConsoleOut(unsigned int argCount)
{
    bytecode->emplace_back(Instruction::CONSOLE_OUT);
    bytecode->emplace_back(argCount);
    for(unsigned int a = 0; a < argCount; a++)
        pop();
}